

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::detachClause(Solver *this,CRef cr,bool strict)

{
  long *plVar1;
  int iVar2;
  uint *puVar3;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted> *this_00;
  Watcher local_30;
  
  puVar3 = RegionAllocator<unsigned_int>::operator[]
                     (&(this->ca).super_RegionAllocator<unsigned_int>,cr);
  iVar2 = (int)((ulong)*(undefined8 *)puVar3 >> 0x20);
  if (1 < iVar2) {
    if (iVar2 == 2) {
      this_00 = &this->watchesBin;
    }
    else {
      this_00 = &this->watches;
    }
    if (strict) {
      local_30.blocker.x = puVar3[4];
      local_30.cref = cr;
      remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>
                ((this_00->occs).data + ((long)(int)puVar3[3] ^ 1),&local_30);
      local_30.blocker.x = puVar3[3];
      local_30.cref = cr;
      remove<Gluco::vec<Gluco::Solver::Watcher>,Gluco::Solver::Watcher>
                ((this_00->occs).data + ((long)(int)puVar3[4] ^ 1),&local_30);
    }
    else {
      local_30.cref = puVar3[3] ^ 1;
      OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
      smudge(this_00,(Lit *)&local_30);
      local_30.cref = puVar3[4] ^ 1;
      OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
      smudge(this_00,(Lit *)&local_30);
    }
    plVar1 = (long *)((long)&this->clauses_literals + (ulong)((uint)*(long *)puVar3 & 4) * 2);
    *plVar1 = *plVar1 - (*(long *)puVar3 >> 0x20);
    return;
  }
  __assert_fail("c.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                ,0x135,"void Gluco::Solver::detachClause(CRef, bool)");
}

Assistant:

void Solver::detachClause(CRef cr, bool strict) {
    const Clause& c = ca[cr];
    
    assert(c.size() > 1);
    if(c.size()==2) {
      if (strict){
        remove(watchesBin[~c[0]], Watcher(cr, c[1]));
        remove(watchesBin[~c[1]], Watcher(cr, c[0]));
      }else{
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        watchesBin.smudge(~c[0]);
        watchesBin.smudge(~c[1]);
      }
    } else {
      if (strict){
        remove(watches[~c[0]], Watcher(cr, c[1]));
        remove(watches[~c[1]], Watcher(cr, c[0]));
      }else{
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        watches.smudge(~c[0]);
        watches.smudge(~c[1]);
      }
    }
    if (c.learnt()) learnts_literals -= c.size();
    else            clauses_literals -= c.size(); }